

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O1

IntrinsicResult MiniScript::intrinsic_code(Context *context,IntrinsicResult partialResult)

{
  TextOutputMethod *pp_Var1;
  long *plVar2;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *pDVar3;
  undefined4 *puVar4;
  unsigned_long uVar5;
  TextOutputMethod inBuf;
  Value self;
  undefined1 local_58 [16];
  Interpreter *local_48;
  anon_union_8_3_2f476f46_for_data local_40;
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *local_38;
  anon_union_8_3_2f476f46_for_data local_30;
  Value local_28;
  
  local_30.tempNum._0_1_ = false;
  pDVar3 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x30);
  (pDVar3->super_RefCountedStorage).refCount = 1;
  (pDVar3->super_RefCountedStorage)._vptr_RefCountedStorage =
       (_func_int **)&PTR__StringStorage_001d10b0;
  pDVar3->mTable[0] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0x5;
  pDVar3->mTable[1] = (HashMapEntry<MiniScript::Value,_MiniScript::Value> *)0xffffffffffffffff;
  puVar4 = (undefined4 *)operator_new__(5);
  pDVar3->mSize = (long)puVar4;
  *(undefined1 *)(puVar4 + 1) = 0;
  *puVar4 = 0x666c6573;
  local_38 = pDVar3;
  Context::GetVar((Context *)local_58,(String *)partialResult.rs,(LocalOnlyMode)&local_38);
  if ((local_38 != (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) &&
     ((bool)local_30.tempNum._0_1_ == false)) {
    plVar2 = &(local_38->super_RefCountedStorage).refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*(local_38->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
    local_38 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0;
  }
  if (local_58[0] == 0) {
    local_28.data.number = 0.0;
  }
  else {
    Value::ToString((Value *)&local_48,(Machine *)local_58);
    if (local_48 == (Interpreter *)0x0) {
      inBuf = (TextOutputMethod)0x1a780e;
    }
    else {
      inBuf = local_48->implicitOutput;
    }
    uVar5 = UTF8Decode((uchar *)inBuf);
    if ((local_48 != (Interpreter *)0x0) && ((bool)local_40.tempNum._0_1_ == false)) {
      pp_Var1 = &local_48->standardOutput;
      *pp_Var1 = *pp_Var1 + -1;
      if (*pp_Var1 == (TextOutputMethod)0x0) {
        (*local_48->_vptr_Interpreter[1])();
      }
      local_48 = (Interpreter *)0x0;
    }
    local_28.data.number = (double)(long)uVar5;
  }
  local_28.type = Number;
  local_28.noInvoke = false;
  local_28.localOnly = Off;
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  Value::operator=((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
                   &local_28);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_28.type) &&
     ((DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)local_28.data.ref !=
      (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0)) {
    plVar2 = &(local_28.data.ref)->refCount;
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (*((RefCountedStorage *)&(local_28.data.ref)->_vptr_RefCountedStorage)->
        _vptr_RefCountedStorage[1])();
    }
    local_28.data.number = 0.0;
  }
  if ((2 < local_58[0]) && ((long *)local_58._8_8_ != (long *)0x0)) {
    plVar2 = (long *)(local_58._8_8_ + 8);
    *plVar2 = *plVar2 + -1;
    if (*plVar2 == 0) {
      (**(code **)(*(long *)local_58._8_8_ + 8))();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_code(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		long codepoint = 0;
		if (not self.IsNull()) codepoint = UTF8Decode((unsigned char*)(self.ToString().c_str()));
		return IntrinsicResult(codepoint);
	}